

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::StrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  ScalarEvolutionAnalysis *pSVar1;
  long value;
  long value_00;
  ulong value_01;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Loop *loop;
  undefined4 extraout_var_01;
  SENode *pSVar5;
  undefined4 extraout_var_02;
  SENode *pSVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar7;
  ulong value_02;
  undefined4 extraout_var_05;
  ulong uVar8;
  size_type *psVar9;
  ulong uVar10;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  destination_value_unknown_nodes;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  source_value_unknown_nodes;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  ScalarEvolutionAnalysis *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  local_270;
  string local_258;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  local_238;
  string local_220;
  string local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Performing StrongSIVTest.","");
  PrintDebug(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  SENode::CollectValueUnknownNodes(&local_238,source);
  SENode::CollectValueUnknownNodes(&local_270,destination);
  if ((local_238.
       super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       local_238.
       super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     (local_270.
      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_270.
      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.","");
    PrintDebug(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    bVar2 = SymbolicStrongSIVTest(this,source,destination,coefficient,distance_entry);
    goto LAB_00616fef;
  }
  iVar3 = (*source->_vptr_SENode[6])(source);
  if (CONCAT44(extraout_var,iVar3) == 0) {
LAB_0061717d:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "StrongSIVTest could not simplify source and destination to SERecurrentNodes so will exit."
               ,"");
    PrintDebug(this,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    distance_entry->direction = ALL;
  }
  else {
    iVar3 = (*destination->_vptr_SENode[6])(destination);
    if (CONCAT44(extraout_var_00,iVar3) == 0) goto LAB_0061717d;
    local_40.first = source;
    local_40.second = destination;
    loop = GetLoopForSubscriptPair(this,&local_40);
    iVar3 = (*source->_vptr_SENode[6])(source);
    pSVar5 = GetConstantTerm(this,loop,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar3));
    iVar3 = (*destination->_vptr_SENode[6])(destination);
    pSVar6 = GetConstantTerm(this,loop,(SERecurrentNode *)CONCAT44(extraout_var_02,iVar3));
    if ((pSVar5 == (SENode *)0x0) || (pSVar6 == (SENode *)0x0)) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,
                 "StrongSIVTest could not collect the constant terms of either source or destination so will exit."
                 ,"");
      PrintDebug(this,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pSVar1 = &this->scalar_evolution_;
      pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction(pSVar1,pSVar6,pSVar5);
      pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar5);
      iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
      iVar4 = (*coefficient->_vptr_SENode[4])(coefficient);
      if (CONCAT44(extraout_var_04,iVar4) == 0 || CONCAT44(extraout_var_03,iVar3) == 0) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"StrongSIVTest could not produce a distance. Must exit.","")
        ;
        PrintDebug(this,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        distance_entry->distance = 7;
      }
      else {
        value = *(long *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
        value_00 = *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30);
        ToString<long>(&local_100,this,value);
        std::operator+(&local_e0,
                       "StrongSIVTest found delta value and coefficient value as constants with values:\n\tdelta value: "
                       ,&local_100);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_290.field_2._M_allocated_capacity = *psVar9;
          local_290.field_2._8_8_ = plVar7[3];
        }
        else {
          local_290.field_2._M_allocated_capacity = *psVar9;
          local_290._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_290._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_298 = pSVar1;
        ToString<long>(&local_120,this,value_00);
        std::operator+(&local_2b8,&local_290,&local_120);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_258.field_2._M_allocated_capacity = *psVar9;
          local_258.field_2._8_8_ = plVar7[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar9;
          local_258._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_258._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        PrintDebug(this,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        value_02 = value / value_00;
        if (value % value_00 == 0) {
          ToString<long>(&local_2b8,this,value_02);
          std::operator+(&local_160,"StrongSIV test found distance as ",&local_2b8);
          PrintDebug(this,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,
                     "StrongSIVTest proved independence through distance not being an integer.","");
          PrintDebug(this,&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          distance_entry->dependence_information = DIRECTION;
          distance_entry->direction = NONE;
          value_02 = 0;
        }
        bVar2 = true;
        if (value % value_00 != 0) goto LAB_00616fef;
        pSVar5 = GetLowerBound(this,loop);
        pSVar6 = GetUpperBound(this,loop);
        if (pSVar6 == (SENode *)0x0 || pSVar5 == (SENode *)0x0) {
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_200,
                     "StrongSIVTest was unable to gather lower and upper bounds.","");
          PrintDebug(this,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a0,"StrongSIVTest found bounds.","");
          PrintDebug(this,&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          pSVar1 = local_298;
          pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction(local_298,pSVar6,pSVar5);
          pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar5);
          iVar3 = (**pSVar5->_vptr_SENode)(pSVar5);
          if (iVar3 == 0) {
            iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
            value_01 = *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 0x30);
            ToString<long>(&local_2b8,this,value_01);
            std::operator+(&local_1c0,
                           "StrongSIVTest found upper_bound - lower_bound as a constant with value "
                           ,&local_2b8);
            PrintDebug(this,&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = -value_02;
            if (0 < (long)value_02) {
              uVar8 = value_02;
            }
            uVar10 = -value_01;
            if (0 < (long)value_01) {
              uVar10 = value_01;
            }
            if (uVar10 < uVar8) {
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,
                         "StrongSIVTest proved independence through distance escaping the loop bounds."
                         ,"");
              PrintDebug(this,&local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              distance_entry->dependence_information = DISTANCE;
              distance_entry->direction = NONE;
              distance_entry->distance = value_02;
              goto LAB_00616fef;
            }
          }
        }
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,
                   "StrongSIVTest could not prove independence. Gathering direction information.",""
                  );
        PrintDebug(this,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((long)value_02 < 1) {
          distance_entry->dependence_information = DISTANCE;
          if (value_02 == 0) {
            distance_entry->direction = EQ;
            distance_entry->distance = 0;
            goto LAB_006171d5;
          }
          distance_entry->direction = GT;
        }
        else {
          distance_entry->dependence_information = DISTANCE;
          distance_entry->direction = LT;
        }
        distance_entry->distance = value_02;
      }
    }
  }
LAB_006171d5:
  bVar2 = false;
LAB_00616fef:
  if (local_270.
      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.
                    super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.
      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool LoopDependenceAnalysis::StrongSIVTest(SENode* source, SENode* destination,
                                           SENode* coefficient,
                                           DistanceEntry* distance_entry) {
  PrintDebug("Performing StrongSIVTest.");
  // If both source and destination are SERecurrentNodes we can perform tests
  // based on distance.
  // If either source or destination contain value unknown nodes or if one or
  // both are not SERecurrentNodes we must attempt a symbolic test.
  std::vector<SEValueUnknown*> source_value_unknown_nodes =
      source->CollectValueUnknownNodes();
  std::vector<SEValueUnknown*> destination_value_unknown_nodes =
      destination->CollectValueUnknownNodes();
  if (source_value_unknown_nodes.size() > 0 ||
      destination_value_unknown_nodes.size() > 0) {
    PrintDebug(
        "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.");
    return SymbolicStrongSIVTest(source, destination, coefficient,
                                 distance_entry);
  }

  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "StrongSIVTest could not simplify source and destination to "
        "SERecurrentNodes so will exit.");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  SENode* source_constant_term =
      GetConstantTerm(subscript_loop, source->AsSERecurrentNode());
  SENode* destination_constant_term =
      GetConstantTerm(subscript_loop, destination->AsSERecurrentNode());
  if (!source_constant_term || !destination_constant_term) {
    PrintDebug(
        "StrongSIVTest could not collect the constant terms of either source "
        "or destination so will exit.");
    return false;
  }
  SENode* constant_term_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination_constant_term, source_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  // We must check the offset delta and coefficient are constants.
  int64_t distance = 0;
  SEConstantNode* delta_constant = constant_term_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    PrintDebug(
        "StrongSIVTest found delta value and coefficient value as constants "
        "with values:\n"
        "\tdelta value: " +
        ToString(delta_value) +
        "\n\tcoefficient value: " + ToString(coefficient_value) + "\n");
    // Check if the distance is not integral to try to prove independence.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "StrongSIVTest proved independence through distance not being an "
          "integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug("StrongSIV test found distance as " + ToString(distance));
    }
  } else {
    // If we can't fold delta and coefficient to single values we can't produce
    // distance.
    // As a result we can't perform the rest of the pass and must assume
    // dependence in all directions.
    PrintDebug("StrongSIVTest could not produce a distance. Must exit.");
    distance_entry->distance = DistanceEntry::Directions::ALL;
    return false;
  }

  // Next we gather the upper and lower bounds as constants if possible. If
  // distance > upper_bound - lower_bound we prove independence.
  SENode* lower_bound = GetLowerBound(subscript_loop);
  SENode* upper_bound = GetUpperBound(subscript_loop);
  if (lower_bound && upper_bound) {
    PrintDebug("StrongSIVTest found bounds.");
    SENode* bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));

    if (bounds->GetType() == SENode::SENodeType::Constant) {
      int64_t bounds_value = bounds->AsSEConstantNode()->FoldToSingleValue();
      PrintDebug(
          "StrongSIVTest found upper_bound - lower_bound as a constant with "
          "value " +
          ToString(bounds_value));

      // If the absolute value of the distance is > upper bound - lower bound
      // then we prove independence.
      if (llabs(distance) > llabs(bounds_value)) {
        PrintDebug(
            "StrongSIVTest proved independence through distance escaping the "
            "loop bounds.");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DISTANCE;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        distance_entry->distance = distance;
        return true;
      }
    }
  } else {
    PrintDebug("StrongSIVTest was unable to gather lower and upper bounds.");
  }

  // Otherwise we can get a direction as follows
  //             { < if distance > 0
  // direction = { = if distance == 0
  //             { > if distance < 0
  PrintDebug(
      "StrongSIVTest could not prove independence. Gathering direction "
      "information.");
  if (distance > 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::LT;
    distance_entry->distance = distance;
    return false;
  }
  if (distance == 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::EQ;
    distance_entry->distance = 0;
    return false;
  }
  if (distance < 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::GT;
    distance_entry->distance = distance;
    return false;
  }

  // We were unable to prove independence or discern any additional information
  // Must assume <=> direction.
  PrintDebug(
      "StrongSIVTest was unable to determine any dependence information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}